

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsmJsByteCodeGenerator.h
# Opt level: O3

RegSlot __thiscall
Js::AsmJSByteCodeGenerator::GetAndReleaseUnaryLocations<int>
          (AsmJSByteCodeGenerator *this,EmitExpressionInfo *rhs)

{
  RegSlot tmpReg;
  AsmJsFunc *pAVar1;
  bool bVar2;
  Types TVar3;
  RegSlot RVar4;
  RegisterSpace *pRVar5;
  
  pAVar1 = this->mFunction;
  TVar3 = WAsmJs::FromPrimitiveType<int>();
  pRVar5 = WAsmJs::TypedRegisterAllocator::GetRegisterSpace(&pAVar1->mTypedRegisterAllocator,TVar3);
  if (((rhs != (EmitExpressionInfo *)0x0) &&
      (RVar4 = (rhs->super_EmitInfoBase).location, RVar4 != 0xffffffff)) &&
     (bVar2 = WAsmJs::RegisterSpace::IsTmpReg(pRVar5,RVar4), bVar2)) {
    return (rhs->super_EmitInfoBase).location;
  }
  pAVar1 = this->mFunction;
  TVar3 = WAsmJs::FromPrimitiveType<int>();
  pRVar5 = WAsmJs::TypedRegisterAllocator::GetRegisterSpace(&pAVar1->mTypedRegisterAllocator,TVar3);
  RVar4 = WAsmJs::RegisterSpace::AcquireTmpRegister(pRVar5);
  pAVar1 = this->mFunction;
  TVar3 = WAsmJs::FromPrimitiveType<int>();
  pRVar5 = WAsmJs::TypedRegisterAllocator::GetRegisterSpace(&pAVar1->mTypedRegisterAllocator,TVar3);
  if ((rhs != (EmitExpressionInfo *)0x0) &&
     (tmpReg = (rhs->super_EmitInfoBase).location, tmpReg != 0xffffffff)) {
    WAsmJs::RegisterSpace::ReleaseTmpRegister(pRVar5,tmpReg);
  }
  return RVar4;
}

Assistant:

RegSlot GetAndReleaseUnaryLocations( const EmitExpressionInfo* rhs )
        {
            RegSlot tmpRegToUse;
            if( mFunction->IsTmpLocation<T>( rhs ) )
            {
                tmpRegToUse = rhs->location;
            }
            else
            {
                tmpRegToUse = mFunction->AcquireTmpRegister<T>();
                mFunction->ReleaseLocation<T>( rhs );
            }
            return tmpRegToUse;
        }